

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFiveAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomFiveAction::Pick(BlueRoomFiveAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  ItemWrapper *this_00;
  string *this_01;
  itemType local_54;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TABLET) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_30,"You can\'t pick up the tablet, it is far too heavy.",
               (allocator *)&local_54);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_30);
    this_01 = &local_30;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != STATUE) {
      pAVar2 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    local_54 = STATUE;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
    ItemWrapper::setLocation(this_00,BACKPACK);
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_50,
               "You lift the statue with considerable effort and are now holding it.",
               (allocator *)&local_54);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_50);
    this_01 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_01);
  return pAVar2;
}

Assistant:

ActionResults * BlueRoomFiveAction::Pick() {
    if(commands->getMainItem() == TABLET) {
       return new ActionResults(CURRENT, "You can't pick up the tablet, it is far too heavy.");
    }

    if(commands->getMainItem() == STATUE){
        itemList->getValue(STATUE)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "You lift the statue with considerable effort and are now holding it.");
    }
    return AbstractRoomAction::Pick();
}